

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

bool __thiscall
absl::log_internal::EncodeBytes
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  bool bVar1;
  uint64_t value_00;
  size_t size;
  size_type sVar2;
  size_t size_00;
  size_type sVar3;
  size_type sVar4;
  pointer __dest;
  pointer __src;
  Span<char> *this_00;
  size_t length_size;
  uint64_t length;
  size_t tag_type_size;
  uint64_t tag_type;
  Span<char> *buf_local;
  uint64_t tag_local;
  Span<const_char> value_local;
  
  this_00 = (Span<char> *)value.len_;
  value_local.ptr_ = value.ptr_;
  tag_local = tag;
  value_00 = anon_unknown_2::MakeTagType((uint64_t)this,kLengthDelimited);
  size = VarintSize(value_00);
  sVar2 = Span<const_char>::size((Span<const_char> *)&tag_local);
  size_00 = VarintSize(sVar2);
  sVar3 = Span<const_char>::size((Span<const_char> *)&tag_local);
  sVar4 = Span<char>::size(this_00);
  bVar1 = size + size_00 + sVar3 <= sVar4;
  if (bVar1) {
    anon_unknown_2::EncodeRawVarint(value_00,size,this_00);
    anon_unknown_2::EncodeRawVarint(sVar2,size_00,this_00);
    __dest = Span<char>::data(this_00);
    __src = Span<const_char>::data((Span<const_char> *)&tag_local);
    sVar2 = Span<const_char>::size((Span<const_char> *)&tag_local);
    memcpy(__dest,__src,sVar2);
    sVar2 = Span<const_char>::size((Span<const_char> *)&tag_local);
    Span<char>::remove_prefix(this_00,sVar2);
  }
  else {
    sVar2 = Span<char>::size(this_00);
    Span<char>::remove_suffix(this_00,sVar2);
  }
  return bVar1;
}

Assistant:

bool EncodeBytes(uint64_t tag, absl::Span<const char> value,
                 absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size = VarintSize(length);
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}